

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_save_file(uchar *buffer,size_t buffersize,char *filename)

{
  FILE *__s;
  char *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  FILE *file;
  uint local_4;
  
  __s = fopen(in_RDX,"wb");
  if (__s == (FILE *)0x0) {
    local_4 = 0x4f;
  }
  else {
    fwrite(in_RDI,1,in_RSI,__s);
    fclose(__s);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned lodepng_save_file(const unsigned char* buffer, size_t buffersize, const char* filename) {
  FILE* file;
  file = fopen(filename, "wb" );
  if(!file) return 79;
  fwrite(buffer, 1, buffersize, file);
  fclose(file);
  return 0;
}